

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_detach.cpp
# Opt level: O3

unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true> __thiscall
duckdb::Transformer::TransformDetach(Transformer *this,PGDetachStmt *stmt)

{
  OnEntryNotFound OVar1;
  char *__s;
  char *pcVar2;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> _Var3;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> _Var4;
  Transformer *this_00;
  DetachInfo *this_01;
  pointer pDVar5;
  pointer pDVar6;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> local_38;
  
  this_00 = (Transformer *)operator_new(0x80);
  DetachStatement::DetachStatement((DetachStatement *)this_00);
  (this->parent).ptr = this_00;
  this_01 = (DetachInfo *)operator_new(0x38);
  DetachInfo::DetachInfo(this_01);
  __s = *(char **)(in_RDX + 8);
  local_38._M_head_impl = this_01;
  pDVar5 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_38);
  pcVar2 = (char *)(pDVar5->name)._M_string_length;
  strlen(__s);
  ::std::__cxx11::string::_M_replace((ulong)&pDVar5->name,0,pcVar2,(ulong)__s);
  OVar1 = *(OnEntryNotFound *)(in_RDX + 0x10);
  pDVar5 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_38);
  pDVar5->if_not_found = OVar1;
  pDVar6 = unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true>::
           operator->((unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true>
                       *)this);
  _Var4._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (DetachInfo *)0x0;
  _Var3._M_head_impl =
       (pDVar6->info).super_unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::DetachInfo_*,_std::default_delete<duckdb::DetachInfo>_>.
       super__Head_base<0UL,_duckdb::DetachInfo_*,_false>._M_head_impl;
  (pDVar6->info).super_unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DetachInfo_*,_std::default_delete<duckdb::DetachInfo>_>.
  super__Head_base<0UL,_duckdb::DetachInfo_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (DetachInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
    if (local_38._M_head_impl != (DetachInfo *)0x0) {
      (*((local_38._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>_>)
         (unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>_>)this;
}

Assistant:

unique_ptr<DetachStatement> Transformer::TransformDetach(duckdb_libpgquery::PGDetachStmt &stmt) {
	auto result = make_uniq<DetachStatement>();
	auto info = make_uniq<DetachInfo>();
	info->name = stmt.db_name;
	info->if_not_found = TransformOnEntryNotFound(stmt.missing_ok);

	result->info = std::move(info);
	return result;
}